

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_mirjit.c
# Opt level: O2

int raviV_compile(lua_State *L,Proto *p,ravi_compile_options_t *options)

{
  ushort uVar1;
  global_State *pgVar2;
  MIR_context_t ctx;
  char *s;
  _Bool _Var3;
  size_t len;
  MIR_module_t_conflict module;
  lua_CFunction p_Var4;
  char *__s;
  lu_byte lVar5;
  int iVar6;
  int iVar7;
  ravi_State *prVar8;
  membuff_t buf;
  char fname [30];
  
  lVar5 = (p->ravi_jit).jit_status;
  if (lVar5 == '\x02') {
    iVar6 = 1;
  }
  else if (lVar5 == '\x01') {
    iVar6 = 0;
  }
  else {
    iVar7 = 0;
    iVar6 = 0;
    if (options != (ravi_compile_options_t *)0x0) {
      pgVar2 = L->l_G;
      prVar8 = pgVar2->ravi_state;
      iVar6 = iVar7;
      if ((prVar8 != (ravi_State *)0x0) && (prVar8->jit != (MIR_context_t)0x0)) {
        if (((ulong)*options & 1) == 0) {
          if ((prVar8->field_0x10 & 8) == 0) {
            return 0;
          }
          if ((((p->ravi_jit).jit_flags != '\x01') && (p->sizecode <= prVar8->min_code_size_)) &&
             (uVar1 = (p->ravi_jit).execution_count, (int)(uint)uVar1 < prVar8->min_exec_count_)) {
            (p->ravi_jit).execution_count = uVar1 + 1;
            return 0;
          }
        }
        _Var3 = raviJ_cancompile(p);
        if (_Var3) {
          if (pgVar2->ravi_state->compiling_ == 0) {
            pgVar2->ravi_state->compiling_ = 1;
            membuff_init(&buf,0x1000);
            __s = fname;
            iVar6 = 0;
            pgVar2->ravi_state->id = pgVar2->ravi_state->id + 1;
            snprintf(__s,0x1e,"jit%lld");
            _Var3 = raviJ_codegen(L,p,options,__s,&buf);
            s = buf.buf;
            lVar5 = '\x01';
            if (_Var3) {
              prVar8 = pgVar2->ravi_state;
              if ((((ulong)*options & 1) != 0) && ((prVar8->field_0x10 & 7) != 0)) {
                len = strlen(buf.buf);
                ravi_writestring(L,s,len);
                ravi_writeline(L);
                prVar8 = pgVar2->ravi_state;
              }
              ctx = prVar8->jit;
              mir_prepare(ctx,2);
              module = mir_compile_C_module(&prVar8->options,ctx,buf.buf,__s);
              iVar6 = 0;
              if (module == (MIR_module_t_conflict)0x0) {
                p_Var4 = (lua_CFunction)0x0;
              }
              else {
                p_Var4 = (lua_CFunction)mir_get_func(ctx,module,fname);
              }
              mir_cleanup(ctx);
              if (p_Var4 != (lua_CFunction)0x0) {
                (p->ravi_jit).jit_data = (void *)0x0;
                (p->ravi_jit).jit_function = p_Var4;
                iVar6 = 1;
                lVar5 = '\x02';
              }
            }
            (p->ravi_jit).jit_status = lVar5;
            membuff_free(&buf);
            pgVar2->ravi_state->compiling_ = 0;
          }
        }
        else {
          (p->ravi_jit).jit_status = '\x01';
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int raviV_compile(struct lua_State *L, struct Proto *p, ravi_compile_options_t *options) {
  if (p->ravi_jit.jit_status == RAVI_JIT_COMPILED)
    return true;
  else if (p->ravi_jit.jit_status == RAVI_JIT_CANT_COMPILE)
    return false;
  if (options == NULL)
    return false;

  global_State *G = G(L);
  if (G->ravi_state == NULL)
    return false;
  if (G->ravi_state->jit == NULL)
    return false;

  bool doCompile = (bool)(options && options->manual_request != 0);
  if (!doCompile && G->ravi_state->auto_) {
    if (p->ravi_jit.jit_flags == RAVI_JIT_FLAG_HASFORLOOP) /* function has fornum loop, so compile */
      doCompile = true;
    else if (p->sizecode > G->ravi_state->min_code_size_) /* function is long so compile */
      doCompile = true;
    else {
      if (p->ravi_jit.execution_count < G->ravi_state->min_exec_count_) /* function has been executed many
                                                                                      times so compile */
        p->ravi_jit.execution_count++;
      else
        doCompile = true;
    }
  }
  if (!doCompile) {
    return false;
  }
  if (!raviJ_cancompile(p)) {
    p->ravi_jit.jit_status = RAVI_JIT_CANT_COMPILE;
    return false;
  }

  if (G->ravi_state->compiling_)
    return false;
  G->ravi_state->compiling_ = 1;

  membuff_t buf;
  membuff_init(&buf, 4096);

  int (*fp)(lua_State * L) = NULL;
  char fname[30];
  snprintf(fname, sizeof fname, "jit%lld", G->ravi_state->id++);
  if (!raviJ_codegen(L, p, options, fname, &buf)) {
    p->ravi_jit.jit_status = RAVI_JIT_CANT_COMPILE;
    goto Lerror;
  }
  if (options->manual_request && G->ravi_state->verbosity_) {
    ravi_writestring(L, buf.buf, strlen(buf.buf));
    ravi_writeline(L);
  }
  fp = compile_C_module(&G->ravi_state->options, G->ravi_state->jit, buf.buf, fname);
  if (!fp) {
    p->ravi_jit.jit_status = RAVI_JIT_CANT_COMPILE;
  }
  else {
    p->ravi_jit.jit_data = NULL;
    p->ravi_jit.jit_function = fp;
    p->ravi_jit.jit_status = RAVI_JIT_COMPILED;
  }
Lerror:
  membuff_free(&buf);
  G->ravi_state->compiling_ = 0;
  return fp != NULL;
}